

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.h
# Opt level: O2

void __thiscall Ptex::v2_2::PtexReader::MetaData::~MetaData(MetaData *this)

{
  ~MetaData(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

~MetaData() {}